

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression *
soul::ExpressionHelpers::fromIdentifier(Expression *__return_storage_ptr__,QualifiedIdentifier *q)

{
  pointer pPVar1;
  bool bVar2;
  ModuleBase *this;
  IdentifierPath *partialName;
  string *this_00;
  pool_ptr<soul::AST::ModuleBase> parentModule;
  string text;
  string resolvedUID;
  Scope local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  
  AST::QualifiedIdentifier::toString_abi_cxx11_(&local_130,q);
  bVar2 = std::operator==(&local_130,"wrap");
  if (!bVar2) {
    bVar2 = std::operator==(&local_130,"clamp");
    if (!bVar2) {
      pPVar1 = (q->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      partialName = (IdentifierPath *)
                    ((long)(q->pathSections).
                           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1);
      if ((partialName == (IdentifierPath *)0x60) &&
         ((pPVar1->specialisationArgs).object == (Expression *)0x0)) {
        AST::Scope::findModule(&local_138);
        if (local_138._vptr_Scope != (_func_int **)0x0) {
          this = pool_ptr<soul::AST::ModuleBase>::operator*
                           ((pool_ptr<soul::AST::ModuleBase> *)&local_138);
          AST::QualifiedIdentifier::getPath((IdentifierPath *)&stack0xffffffffffffff90,q);
          resolvePartialNameAsUID_abi_cxx11_
                    (&local_110,(ExpressionHelpers *)this,(ModuleBase *)&stack0xffffffffffffff90,
                     partialName);
          ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                    ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&stack0xffffffffffffff90);
          if (local_110._M_string_length != 0) {
            std::__cxx11::string::string((string *)&local_b0,(string *)&local_130);
            std::__cxx11::string::string((string *)&local_d0,(string *)&local_110);
            createStruct(__return_storage_ptr__,&local_b0,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            this_00 = &local_110;
            goto LAB_00260594;
          }
          std::__cxx11::string::~string((string *)&local_110);
        }
      }
      std::__cxx11::string::string((string *)&local_f0,(string *)&local_130);
      createText(__return_storage_ptr__,&local_f0);
      this_00 = &local_f0;
      goto LAB_00260594;
    }
  }
  std::__cxx11::string::string((string *)&local_90,(string *)&local_130);
  createPrimitive(__return_storage_ptr__,&local_90);
  this_00 = &local_90;
LAB_00260594:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression fromIdentifier (AST::QualifiedIdentifier& q)
    {
        auto text = q.toString();

        if (text == "wrap" || text == "clamp")
            return createPrimitive (text);

        if (q.isSimplePath())
        {
            if (auto parentModule = q.getParentScope()->findModule())
            {
                auto resolvedUID = resolvePartialNameAsUID (*parentModule, q.getPath());

                if (! resolvedUID.empty())
                    return createStruct (text, resolvedUID);
            }
        }

        return createText (text);
    }